

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O3

int Abc_NtkFraigStore(Abc_Ntk_t *pNtkAdd)

{
  size_t __size;
  int iVar1;
  Abc_Ntk_t *pNtkOld;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  iVar1 = 0;
  pNtkOld = Abc_NtkStrash(pNtkAdd,0,0,0);
  if (pNtkOld == (Abc_Ntk_t *)0x0) {
    puts("Abc_NtkFraigStore: Initial strashing has failed.");
  }
  else {
    pVVar2 = Abc_FrameReadStore();
    iVar1 = pVVar2->nSize;
    if (0 < iVar1) {
      iVar1 = Abc_NodeCompareCiCo(pNtkOld,(Abc_Ntk_t *)*pVVar2->pArray);
      if (iVar1 == 0) {
        if (pVVar2->nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar1 = Abc_NtkCompareSignals(pNtkOld,(Abc_Ntk_t *)*pVVar2->pArray,1,1);
        if (iVar1 == 0) {
          puts("Trying to store the network with different primary inputs.");
          puts("The previously stored networks are deleted and this one is added.");
          Abc_NtkFraigStoreClean();
        }
      }
      iVar1 = pVVar2->nSize;
    }
    if (iVar1 == pVVar2->nCap) {
      if (iVar1 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar3;
        pVVar2->nCap = 0x10;
      }
      else {
        __size = (ulong)(uint)(iVar1 * 2) * 8;
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(__size);
        }
        else {
          ppvVar3 = (void **)realloc(pVVar2->pArray,__size);
        }
        pVVar2->pArray = ppvVar3;
        pVVar2->nCap = iVar1 * 2;
      }
    }
    else {
      ppvVar3 = pVVar2->pArray;
    }
    iVar1 = pVVar2->nSize;
    pVVar2->nSize = iVar1 + 1;
    ppvVar3[iVar1] = pNtkOld;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_NtkFraigStore( Abc_Ntk_t * pNtkAdd )
{
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk;
    // create the network to be stored
    pNtk = Abc_NtkStrash( pNtkAdd, 0, 0, 0 );
    if ( pNtk == NULL )
    {
        printf( "Abc_NtkFraigStore: Initial strashing has failed.\n" );
        return 0;
    }
    // get the network currently stored
    vStore = Abc_FrameReadStore();
    if ( Vec_PtrSize(vStore) > 0 )
    {
        // check that the networks have the same PIs
        extern int Abc_NodeCompareCiCo( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew );
        if ( !Abc_NodeCompareCiCo(pNtk, (Abc_Ntk_t *)Vec_PtrEntry(vStore, 0)) )
        {
            // reorder PIs of pNtk2 according to pNtk1
            if ( !Abc_NtkCompareSignals( pNtk, (Abc_Ntk_t *)Vec_PtrEntry(vStore, 0), 1, 1 ) )
            {
                printf( "Trying to store the network with different primary inputs.\n" );
                printf( "The previously stored networks are deleted and this one is added.\n" );
                Abc_NtkFraigStoreClean();
            }
        }
    }
    Vec_PtrPush( vStore, pNtk );
//    printf( "The number of AIG nodes added to storage = %5d.\n", Abc_NtkNodeNum(pNtk) );
    return 1;
}